

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

void nhdp_domain_mpr_remove(nhdp_domain_mpr *mpr)

{
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_domain *domain;
  nhdp_domain_mpr *mpr_local;
  
  __tempptr = _domain_list.next + -0x2a;
  do {
    if (__tempptr[0x2a].prev == _domain_list.prev) {
LAB_0013b004:
      avl_remove(&_domain_mprs,&mpr->_node);
      return;
    }
    if ((nhdp_domain_mpr *)__tempptr[2].prev == mpr) {
      _remove_mpr((nhdp_domain *)__tempptr);
      goto LAB_0013b004;
    }
    __tempptr = __tempptr[0x2a].next + -0x2a;
  } while( true );
}

Assistant:

void
nhdp_domain_mpr_remove(struct nhdp_domain_mpr *mpr) {
  struct nhdp_domain *domain;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->mpr == mpr) {
      _remove_mpr(domain);
      break;
    }
  }

  avl_remove(&_domain_mprs, &mpr->_node);
}